

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

void anon_unknown.dwarf_41187::getFunctionsToKeepAndSplit
               (Module *wasm,uint64_t wasmHash,string *profileFile,
               set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *keepFuncs,
               set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *splitFuncs)

{
  anon_class_32_4_82a7654c visitor;
  size_type sVar1;
  Fatal *this;
  size_type sVar2;
  Fatal local_398;
  size_type *local_210;
  undefined1 *puStack_208;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *local_200;
  pointer puStack_1f8;
  size_type local_1f0;
  size_t i;
  Fatal local_1d8;
  undefined1 local_50 [8];
  ProfileData profile;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *splitFuncs_local;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *keepFuncs_local;
  string *profileFile_local;
  uint64_t wasmHash_local;
  Module *wasm_local;
  
  profile.timestamps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)splitFuncs;
  readProfile((ProfileData *)local_50,profileFile);
  if (local_50 != (undefined1  [8])wasmHash) {
    ::wasm::Fatal::Fatal(&local_1d8);
    this = ::wasm::Fatal::operator<<
                     (&local_1d8,
                      (char (*) [60])"error: checksum in profile does not match module checksum. ");
    ::wasm::Fatal::operator<<
              (this,(char (*) [110])
                    "The module to split must be the original, uninstrumented module, not the module used to generate the profile."
              );
    ::wasm::Fatal::~Fatal(&local_1d8);
  }
  local_1f0 = 0;
  local_210 = &local_1f0;
  puStack_208 = local_50;
  puStack_1f8 = profile.timestamps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  visitor.profile = (ProfileData *)puStack_208;
  visitor.i = local_210;
  visitor.keepFuncs = keepFuncs;
  visitor.splitFuncs =
       (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
       profile.timestamps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_200 = keepFuncs;
  ::wasm::ModuleUtils::
  iterDefinedFunctions<(anonymous_namespace)::getFunctionsToKeepAndSplit(wasm::Module&,unsigned_long,std::__cxx11::string_const&,std::set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>>&,std::set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>>&)::__0>
            (wasm,visitor);
  sVar1 = local_1f0;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&profile);
  if (sVar1 != sVar2) {
    ::wasm::Fatal::Fatal(&local_398);
    ::wasm::Fatal::operator<<(&local_398,(char (*) [30])"Unexpected extra profile data");
    ::wasm::Fatal::~Fatal(&local_398);
  }
  ProfileData::~ProfileData((ProfileData *)local_50);
  return;
}

Assistant:

void getFunctionsToKeepAndSplit(Module& wasm,
                                uint64_t wasmHash,
                                const std::string& profileFile,
                                std::set<Name>& keepFuncs,
                                std::set<Name>& splitFuncs) {
  ProfileData profile = readProfile(profileFile);
  if (profile.hash != wasmHash) {
    Fatal() << "error: checksum in profile does not match module checksum. "
            << "The module to split must be the original, uninstrumented "
               "module, not the module used to generate the profile.";
  }

  size_t i = 0;
  ModuleUtils::iterDefinedFunctions(wasm, [&](Function* func) {
    if (i >= profile.timestamps.size()) {
      Fatal() << "Unexpected end of profile data";
    }
    if (profile.timestamps[i++] > 0) {
      keepFuncs.insert(func->name);
    } else {
      splitFuncs.insert(func->name);
    }
  });
  if (i != profile.timestamps.size()) {
    Fatal() << "Unexpected extra profile data";
  }
}